

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

List<String> * Process::environment(void)

{
  vector<String,_std::allocator<String>_> *in_RDI;
  String local_40;
  undefined1 local_19;
  long *local_18;
  char **cur;
  List<String> *env;
  
  local_18 = _environ;
  local_19 = 0;
  List<String>::List((List<String> *)in_RDI);
  for (; *local_18 != 0; local_18 = local_18 + 1) {
    String::String(&local_40,(char *)*local_18,0xffffffffffffffff);
    std::vector<String,_std::allocator<String>_>::push_back(in_RDI,&local_40);
    String::~String(&local_40);
  }
  return (List<String> *)in_RDI;
}

Assistant:

List<String> Process::environment()
{
#ifdef OS_Darwin
    char **cur = *_NSGetEnviron();
#else
    extern char** environ;
    char** cur = environ;
#endif
    List<String> env;
    while (*cur) {
        env.push_back(*cur);
        ++cur;
    }
    return env;
}